

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTruth.c
# Opt level: O3

int If_CutComputeTruth(If_Man_t *p,If_Cut_t *pCut,If_Cut_t *pCut0,If_Cut_t *pCut1,int fCompl0,
                      int fCompl1)

{
  Vec_Mem_t *pVVar1;
  Vec_Mem_t *pVVar2;
  word *pwVar3;
  word *pTruth;
  word *pTruth_00;
  word *pTruth_01;
  Vec_Wec_t *pVVar4;
  undefined1 *puVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  Vec_Int_t *pVVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  word *pwVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  Vec_Int_t *p_00;
  
  uVar15 = pCut0->iCutFunc;
  if ((int)uVar15 < 0) {
LAB_00438887:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  uVar19 = *(uint *)&pCut0->field_0x1c >> 0x18;
  pVVar1 = p->vTtMem[uVar19];
  uVar10 = uVar15 >> 1;
  if (pVVar1->nEntries <= (int)uVar10) {
LAB_004388a6:
    __assert_fail("i >= 0 && i < p->nEntries",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                  ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
  }
  uVar9 = pCut1->iCutFunc;
  if ((int)uVar9 < 0) goto LAB_00438887;
  pVVar2 = p->vTtMem[(byte)pCut1->field_0x1f];
  uVar13 = uVar9 >> 1;
  if (pVVar2->nEntries <= (int)uVar13) goto LAB_004388a6;
  iVar11 = (uVar10 & pVVar1->PageMask) * pVVar1->nEntrySize;
  pwVar17 = pVVar1->ppPages[uVar10 >> ((byte)pVVar1->LogPageSze & 0x1f)];
  iVar14 = (uVar13 & pVVar2->PageMask) * pVVar2->nEntrySize;
  pwVar3 = pVVar2->ppPages[uVar13 >> ((byte)pVVar2->LogPageSze & 0x1f)];
  pTruth = (word *)p->puTemp[0];
  pTruth_00 = (word *)p->puTemp[1];
  pTruth_01 = (word *)p->puTemp[2];
  uVar10 = p->nTruth6Words[uVar19];
  if ((*(uint *)&pCut0->field_0x1c >> 0xc & 1 ^ fCompl0) == (uVar15 & 1)) {
    if (0 < (int)uVar10) {
      uVar18 = 0;
      do {
        pTruth[uVar18] = pwVar17[(long)iVar11 + uVar18];
        uVar18 = uVar18 + 1;
      } while (uVar10 != uVar18);
    }
  }
  else if (0 < (int)uVar10) {
    uVar18 = 0;
    do {
      pTruth[uVar18] = ~pwVar17[(long)iVar11 + uVar18];
      uVar18 = uVar18 + 1;
    } while (uVar10 != uVar18);
  }
  uVar15 = p->nTruth6Words[*(uint *)&pCut1->field_0x1c >> 0x18];
  if ((*(uint *)&pCut1->field_0x1c >> 0xc & 1 ^ fCompl1) == (uVar9 & 1)) {
    if (0 < (int)uVar15) {
      uVar18 = 0;
      do {
        pTruth_00[uVar18] = pwVar3[(long)iVar14 + uVar18];
        uVar18 = uVar18 + 1;
      } while (uVar15 != uVar18);
    }
  }
  else if (0 < (int)uVar15) {
    uVar18 = 0;
    do {
      pTruth_00[uVar18] = ~pwVar3[(long)iVar14 + uVar18];
      uVar18 = uVar18 + 1;
    } while (uVar15 != uVar18);
  }
  uVar15 = *(uint *)&pCut0->field_0x1c;
  uVar10 = *(uint *)&pCut->field_0x1c;
  uVar19 = uVar10 >> 0x18;
  if (uVar15 >> 0x18 != uVar19) {
    if (uVar19 <= uVar15 >> 0x18) goto LAB_004388e4;
    uVar9 = 1 << ((char)(uVar15 >> 0x18) - 6U & 0x1f);
    if (uVar15 < 0x7000000) {
      uVar9 = 1;
    }
    uVar15 = 1 << ((char)(uVar10 >> 0x18) - 6U & 0x1f);
    if (uVar10 < 0x7000000) {
      uVar15 = 1;
    }
    if (uVar9 != uVar15) {
      if ((int)uVar15 <= (int)uVar9) goto LAB_00438941;
      if (0 < (int)uVar15) {
        lVar16 = 0;
        pwVar17 = pTruth;
        do {
          if (0 < (int)uVar9) {
            uVar18 = 0;
            do {
              pwVar17[uVar18] = pTruth[uVar18];
              uVar18 = uVar18 + 1;
            } while (uVar9 != uVar18);
          }
          lVar16 = lVar16 + (int)uVar9;
          pwVar17 = pwVar17 + (int)uVar9;
        } while (lVar16 < (long)(ulong)uVar15);
        uVar10 = *(uint *)&pCut->field_0x1c;
        uVar19 = uVar10 >> 0x18;
      }
    }
  }
  uVar15 = *(uint *)&pCut1->field_0x1c;
  if (uVar15 >> 0x18 != uVar19) {
    if (uVar19 <= uVar15 >> 0x18) {
LAB_004388e4:
      __assert_fail("nVarS < nVarB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x47d,"void Abc_TtStretch6(word *, int, int)");
    }
    uVar9 = 1 << ((char)(uVar15 >> 0x18) - 6U & 0x1f);
    if (uVar15 < 0x7000000) {
      uVar9 = 1;
    }
    uVar15 = 1 << ((char)uVar19 - 6U & 0x1f);
    if (uVar10 < 0x7000000) {
      uVar15 = 1;
    }
    if (uVar9 != uVar15) {
      if ((int)uVar15 <= (int)uVar9) {
LAB_00438941:
        __assert_fail("step < nWords",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x482,"void Abc_TtStretch6(word *, int, int)");
      }
      if (0 < (int)uVar15) {
        lVar16 = 0;
        pwVar17 = pTruth_00;
        do {
          if (0 < (int)uVar9) {
            uVar18 = 0;
            do {
              pwVar17[uVar18] = pTruth_00[uVar18];
              uVar18 = uVar18 + 1;
            } while (uVar9 != uVar18);
          }
          lVar16 = lVar16 + (int)uVar9;
          pwVar17 = pwVar17 + (int)uVar9;
        } while (lVar16 < (long)(ulong)uVar15);
        uVar10 = *(uint *)&pCut->field_0x1c;
        uVar19 = uVar10 >> 0x18;
      }
    }
  }
  uVar15 = (*(uint *)&pCut0->field_0x1c >> 0x18) - 1;
  if (0xffffff < *(uint *)&pCut0->field_0x1c && 0xffffff < uVar10) {
    uVar18 = (ulong)uVar19;
    do {
      uVar20 = uVar18 - 1;
      if ((int)*(float *)(&pCut->field_0x1c + uVar18 * 4) <= (int)(&pCut0[1].Area)[uVar15]) {
        if (*(float *)(&pCut->field_0x1c + uVar18 * 4) != (&pCut0[1].Area)[uVar15])
        goto LAB_00438868;
        if (uVar15 < uVar20) {
          Abc_TtSwapVars(pTruth,uVar19,uVar15,(int)uVar20);
        }
        uVar15 = uVar15 - 1;
      }
    } while ((1 < uVar18) && (uVar18 = uVar20, -1 < (int)uVar15));
  }
  if (uVar15 == 0xffffffff) {
    uVar15 = (*(uint *)&pCut1->field_0x1c >> 0x18) - 1;
    if (0xffffff < *(uint *)&pCut1->field_0x1c && 0xffffff < *(uint *)&pCut->field_0x1c) {
      uVar10 = *(uint *)&pCut->field_0x1c >> 0x18;
      uVar18 = (ulong)uVar10;
      do {
        uVar20 = uVar18 - 1;
        if ((int)*(float *)(&pCut->field_0x1c + uVar18 * 4) <= (int)(&pCut1[1].Area)[uVar15]) {
          if (*(float *)(&pCut->field_0x1c + uVar18 * 4) != (&pCut1[1].Area)[uVar15]) {
LAB_00438868:
            __assert_fail("pCut[i] == pCut0[k]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                          ,0x73c,"void Abc_TtExpand(word *, int, int *, int, int *, int)");
          }
          if (uVar15 < uVar20) {
            Abc_TtSwapVars(pTruth_00,uVar10,uVar15,(int)uVar20);
          }
          uVar15 = uVar15 - 1;
        }
      } while ((1 < uVar18) && (uVar18 = uVar20, -1 < (int)uVar15));
    }
    if (uVar15 == 0xffffffff) {
      uVar15 = p->nTruth6Words[(byte)pCut->field_0x1f];
      uVar10 = (uint)*pTruth_00 & (uint)*pTruth & 1;
      if (uVar10 == 0) {
        if (0 < (int)uVar15) {
          uVar18 = 0;
          do {
            pTruth_01[uVar18] = pTruth_00[uVar18] & pTruth[uVar18];
            uVar18 = uVar18 + 1;
          } while (uVar15 != uVar18);
        }
      }
      else if (0 < (int)uVar15) {
        uVar18 = 0;
        do {
          pTruth_01[uVar18] = ~(pTruth_00[uVar18] & pTruth[uVar18]);
          uVar18 = uVar18 + 1;
        } while (uVar15 != uVar18);
      }
      uVar15 = *(uint *)&pCut->field_0x1c;
      iVar11 = 0;
      if (p->pPars->fCutMin != 0) {
        uVar19 = uVar15 >> 0x18;
        if (((*(uint *)&pCut1->field_0x1c < 0x1000000) || (*(uint *)&pCut0->field_0x1c < 0x1000000))
           || (iVar11 = 0,
              uVar19 < (*(uint *)&pCut1->field_0x1c >> 0x18) + (*(uint *)&pCut0->field_0x1c >> 0x18)
              )) {
          uVar19 = Abc_TtMinBase(pTruth_01,(int *)(pCut + 1),uVar19,uVar19);
          uVar15 = *(uint *)&pCut->field_0x1c;
          iVar11 = 0;
          if ((int)uVar19 < (int)(uVar15 >> 0x18)) {
            uVar15 = uVar15 & 0xffffff | uVar19 << 0x18;
            *(uint *)&pCut->field_0x1c = uVar15;
            if ((uVar19 & 0xff) == 0) {
              uVar9 = 0;
            }
            else {
              uVar18 = 0;
              uVar9 = 0;
              do {
                uVar9 = uVar9 | 1 << (uint)(&pCut[1].Area)[uVar18] % 0x1f;
                uVar18 = uVar18 + 1;
              } while ((uVar19 & 0xff) != uVar18);
            }
            pCut->uSign = uVar9;
            iVar11 = 1;
          }
        }
      }
      iVar14 = p->vTtMem[uVar15 >> 0x18]->nEntries;
      iVar6 = Vec_MemHashInsert(p->vTtMem[uVar15 >> 0x18],pTruth_01);
      if (-1 < iVar6) {
        pCut->iCutFunc = uVar10 + iVar6 * 2;
        if ((*pTruth_01 & 1) != 0) {
          __assert_fail("(pTruth[0] & 1) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTruth.c"
                        ,0x7f,
                        "int If_CutComputeTruth(If_Man_t *, If_Cut_t *, If_Cut_t *, If_Cut_t *, int, int)"
                       );
        }
        pVVar4 = p->vTtIsops[(byte)pCut->field_0x1f];
        if ((pVVar4 != (Vec_Wec_t *)0x0) && (iVar14 != p->vTtMem[(byte)pCut->field_0x1f]->nEntries))
        {
          uVar15 = pVVar4->nSize;
          if (uVar15 == pVVar4->nCap) {
            if ((int)uVar15 < 0x10) {
              if (pVVar4->pArray == (Vec_Int_t *)0x0) {
                pVVar7 = (Vec_Int_t *)malloc(0x100);
              }
              else {
                pVVar7 = (Vec_Int_t *)realloc(pVVar4->pArray,0x100);
                uVar15 = pVVar4->nCap;
              }
              pVVar4->pArray = pVVar7;
              iVar6 = 0x10 - uVar15;
              pVVar7 = pVVar7 + (int)uVar15;
              iVar14 = 0x10;
            }
            else {
              iVar14 = uVar15 * 2;
              if (pVVar4->pArray == (Vec_Int_t *)0x0) {
                pVVar7 = (Vec_Int_t *)malloc((ulong)uVar15 << 5);
              }
              else {
                pVVar7 = (Vec_Int_t *)realloc(pVVar4->pArray,(ulong)uVar15 << 5);
                uVar15 = pVVar4->nCap;
              }
              pVVar4->pArray = pVVar7;
              iVar6 = iVar14 - uVar15;
              pVVar7 = pVVar7 + (int)uVar15;
            }
            memset(pVVar7,0,(long)iVar6 << 4);
            pVVar4->nCap = iVar14;
            uVar15 = pVVar4->nSize;
          }
          uVar10 = uVar15 + 1;
          pVVar4->nSize = uVar10;
          if ((int)uVar15 < 0) {
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                          ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
          }
          pVVar7 = pVVar4->pArray;
          iVar14 = Kit_TruthIsop((uint *)pTruth_01,(uint)(byte)pCut->field_0x1f,p->vCover,1);
          if (-1 < iVar14) {
            p_00 = pVVar7 + ((ulong)uVar10 - 1);
            pVVar12 = p->vCover;
            iVar6 = pVVar12->nSize;
            if (p_00->nCap < iVar6) {
              if (pVVar7[(ulong)uVar10 - 1].pArray == (int *)0x0) {
                piVar8 = (int *)malloc((long)iVar6 << 2);
              }
              else {
                piVar8 = (int *)realloc(pVVar7[(ulong)uVar10 - 1].pArray,(long)iVar6 << 2);
              }
              pVVar7[(ulong)uVar10 - 1].pArray = piVar8;
              if (piVar8 == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              p_00->nCap = iVar6;
              pVVar12 = p->vCover;
              iVar6 = pVVar12->nSize;
            }
            if (0 < iVar6) {
              lVar16 = 0;
              do {
                Vec_IntPush(p_00,pVVar12->pArray[lVar16]);
                lVar16 = lVar16 + 1;
              } while (lVar16 < pVVar12->nSize);
            }
            if (iVar14 != 0) {
              puVar5 = (undefined1 *)((long)&pVVar7[(ulong)uVar10 - 1].nCap + 2);
              *puVar5 = *puVar5 ^ 1;
            }
          }
          if (p->vTtIsops[(byte)pCut->field_0x1f]->nSize !=
              p->vTtMem[(byte)pCut->field_0x1f]->nEntries) {
            __assert_fail("Vec_WecSize(p->vTtIsops[pCut->nLeaves]) == Vec_MemEntryNum(p->vTtMem[pCut->nLeaves])"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTruth.c"
                          ,0x93,
                          "int If_CutComputeTruth(If_Man_t *, If_Cut_t *, If_Cut_t *, If_Cut_t *, int, int)"
                         );
          }
        }
        return iVar11;
      }
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
  }
  __assert_fail("k == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                ,0x741,"void Abc_TtExpand(word *, int, int *, int, int *, int)");
}

Assistant:

int If_CutComputeTruth( If_Man_t * p, If_Cut_t * pCut, If_Cut_t * pCut0, If_Cut_t * pCut1, int fCompl0, int fCompl1 )
{
    int fCompl, truthId, nLeavesNew, PrevSize, RetValue = 0;
    word * pTruth0s = Vec_MemReadEntry( p->vTtMem[pCut0->nLeaves], Abc_Lit2Var(pCut0->iCutFunc) );
    word * pTruth1s = Vec_MemReadEntry( p->vTtMem[pCut1->nLeaves], Abc_Lit2Var(pCut1->iCutFunc) );
    word * pTruth0  = (word *)p->puTemp[0];
    word * pTruth1  = (word *)p->puTemp[1];
    word * pTruth   = (word *)p->puTemp[2];
    Abc_TtCopy( pTruth0, pTruth0s, p->nTruth6Words[pCut0->nLeaves], fCompl0 ^ pCut0->fCompl ^ Abc_LitIsCompl(pCut0->iCutFunc) );
    Abc_TtCopy( pTruth1, pTruth1s, p->nTruth6Words[pCut1->nLeaves], fCompl1 ^ pCut1->fCompl ^ Abc_LitIsCompl(pCut1->iCutFunc) );
    Abc_TtStretch6( pTruth0, pCut0->nLeaves, pCut->nLeaves );
    Abc_TtStretch6( pTruth1, pCut1->nLeaves, pCut->nLeaves );
    Abc_TtExpand( pTruth0, pCut->nLeaves, pCut0->pLeaves, pCut0->nLeaves, pCut->pLeaves, pCut->nLeaves );
    Abc_TtExpand( pTruth1, pCut->nLeaves, pCut1->pLeaves, pCut1->nLeaves, pCut->pLeaves, pCut->nLeaves );
    fCompl         = (pTruth0[0] & pTruth1[0] & 1);
    Abc_TtAnd( pTruth, pTruth0, pTruth1, p->nTruth6Words[pCut->nLeaves], fCompl );
    if ( p->pPars->fCutMin && (pCut0->nLeaves + pCut1->nLeaves > pCut->nLeaves || pCut0->nLeaves == 0 || pCut1->nLeaves == 0) )
    {
        nLeavesNew = Abc_TtMinBase( pTruth, pCut->pLeaves, pCut->nLeaves, pCut->nLeaves );
        if ( nLeavesNew < If_CutLeaveNum(pCut) )
        {
            pCut->nLeaves = nLeavesNew;
            pCut->uSign   = If_ObjCutSignCompute( pCut );
            RetValue      = 1;
        }
    }
    PrevSize       = Vec_MemEntryNum( p->vTtMem[pCut->nLeaves] );   
    truthId        = Vec_MemHashInsert( p->vTtMem[pCut->nLeaves], pTruth );
    pCut->iCutFunc = Abc_Var2Lit( truthId, fCompl );
    assert( (pTruth[0] & 1) == 0 );
#ifdef IF_TRY_NEW
    {
        word pCopy[1024];
        char pCanonPerm[16];
        memcpy( pCopy, If_CutTruthW(pCut), sizeof(word) * p->nTruth6Words[pCut->nLeaves] );
        Abc_TtCanonicize( pCopy, pCut->nLeaves, pCanonPerm );
    }
#endif
    if ( p->vTtIsops[pCut->nLeaves] && PrevSize != Vec_MemEntryNum(p->vTtMem[pCut->nLeaves]) )
    {
        Vec_Int_t * vLevel = Vec_WecPushLevel( p->vTtIsops[pCut->nLeaves] );
        fCompl = Kit_TruthIsop( (unsigned *)pTruth, pCut->nLeaves, p->vCover, 1 );
        if ( fCompl >= 0 )
        {
            Vec_IntGrow( vLevel, Vec_IntSize(p->vCover) );
            Vec_IntAppend( vLevel, p->vCover );
            if ( fCompl )
                vLevel->nCap ^= (1<<16); // hack to remember complemented attribute
        }
        assert( Vec_WecSize(p->vTtIsops[pCut->nLeaves]) == Vec_MemEntryNum(p->vTtMem[pCut->nLeaves]) );
    }
    return RetValue;
}